

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biquad.cpp
# Opt level: O0

void __thiscall
BiquadFilterR<float>::process
          (BiquadFilterR<float> *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  anon_class_40_7_dd82e948 __unary_op;
  const_iterator pfVar1;
  const_iterator pfVar2;
  undefined8 in_RCX;
  undefined4 *in_RDI;
  anon_class_40_7_dd82e948 proc_sample;
  float z2;
  float z1;
  float a2;
  float a1;
  float b2;
  float b1;
  float b0;
  float *in_stack_ffffffffffffff70;
  float *pfStack_88;
  float *local_80;
  float *pfStack_78;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  span<const_float,_18446744073709551615UL> local_10;
  
  local_68 = in_RDI[2];
  local_64 = in_RDI[3];
  local_60 = in_RDI[4];
  local_5c = in_RDI[5];
  local_58 = in_RDI[6];
  local_38 = *in_RDI;
  local_3c = in_RDI[1];
  local_50 = &local_38;
  local_48 = &local_3c;
  local_34 = local_58;
  local_30 = local_5c;
  local_2c = local_60;
  local_28 = local_64;
  local_24 = local_68;
  local_20 = in_RCX;
  pfVar1 = al::span<const_float,_18446744073709551615UL>::cbegin(&local_10);
  pfVar2 = al::span<const_float,_18446744073709551615UL>::cend(&local_10);
  memcpy(&stack0xffffffffffffff70,&local_68,0x28);
  __unary_op._8_8_ = pfVar2;
  __unary_op._0_8_ = pfVar1;
  __unary_op._16_8_ = local_20;
  __unary_op.z1 = (float *)in_RDI;
  __unary_op.z2 = in_stack_ffffffffffffff70;
  std::
  transform<float_const*,float*,BiquadFilterR<float>::process(al::span<float_const,18446744073709551615ul>,float*)::_lambda(float)_1_>
            (pfStack_78,local_80,pfStack_88,__unary_op);
  *in_RDI = local_38;
  in_RDI[1] = local_3c;
  return;
}

Assistant:

void BiquadFilterR<Real>::process(const al::span<const Real> src, Real *dst)
{
    const Real b0{mB0};
    const Real b1{mB1};
    const Real b2{mB2};
    const Real a1{mA1};
    const Real a2{mA2};
    Real z1{mZ1};
    Real z2{mZ2};

    /* Processing loop is Transposed Direct Form II. This requires less storage
     * compared to Direct Form I (only two delay components, instead of a four-
     * sample history; the last two inputs and outputs), and works better for
     * floating-point which favors summing similarly-sized values while being
     * less bothered by overflow.
     *
     * See: http://www.earlevel.com/main/2003/02/28/biquads/
     */
    auto proc_sample = [b0,b1,b2,a1,a2,&z1,&z2](Real input) noexcept -> Real
    {
        const Real output{input*b0 + z1};
        z1 = input*b1 - output*a1 + z2;
        z2 = input*b2 - output*a2;
        return output;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);

    mZ1 = z1;
    mZ2 = z2;
}